

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizing.cpp
# Opt level: O0

Matrix * v2m(Matrix *__return_storage_ptr__,Vec3f *v)

{
  value_type vVar1;
  vector<float,_std::allocator<float>_> *pvVar2;
  reference pvVar3;
  Vec3f *v_local;
  Matrix *m;
  
  Matrix::Matrix(__return_storage_ptr__,4,1);
  vVar1 = v->x;
  pvVar2 = Matrix::operator[](__return_storage_ptr__,0);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](pvVar2,0);
  *pvVar3 = vVar1;
  vVar1 = v->y;
  pvVar2 = Matrix::operator[](__return_storage_ptr__,1);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](pvVar2,0);
  *pvVar3 = vVar1;
  vVar1 = v->z;
  pvVar2 = Matrix::operator[](__return_storage_ptr__,2);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](pvVar2,0);
  *pvVar3 = vVar1;
  pvVar2 = Matrix::operator[](__return_storage_ptr__,3);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](pvVar2,0);
  *pvVar3 = 1.0;
  return __return_storage_ptr__;
}

Assistant:

Matrix v2m(const Vec3f &v) {
    Matrix m(4, 1);
    m[0][0] = v.x;
    m[1][0] = v.y;
    m[2][0] = v.z;
    m[3][0] = 1.f;
    return m;
}